

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O2

compile_errcode __thiscall Default::Parse(Default *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  int iVar2;
  Statement *pSVar3;
  allocator local_51;
  string local_50;
  
  iVar2 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    if (iVar2 == 0) {
      iVar2 = 1;
      if (SVar1 != DEFAULT_SYM) {
        return -1;
      }
    }
    else {
      if (iVar2 != 1) {
        pSVar3 = (Statement *)operator_new(0x1e8);
        Statement::Statement(pSVar3);
        this->m_statement_ptr = pSVar3;
        iVar2 = (**(pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface)(pSVar3);
        pSVar3 = this->m_statement_ptr;
        if (iVar2 != 0) {
          if (pSVar3 != (Statement *)0x0) {
            Statement::~Statement(pSVar3);
          }
          operator_delete(pSVar3);
          return -1;
        }
        (*(pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar3);
        pSVar3 = this->m_statement_ptr;
        if (pSVar3 != (Statement *)0x0) {
          Statement::~Statement(pSVar3);
        }
        operator_delete(pSVar3);
        return 0;
      }
      iVar2 = 2;
      if (SVar1 != COLON_SYM) {
        std::__cxx11::string::string((string *)&local_50,"expected a \':\'",&local_51);
        GrammaErrorLogs(log_tools_ptr,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        return -1;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode Default::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ':'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Parse()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}